

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderPrecisionTests.cpp
# Opt level: O1

void __thiscall
deqp::gles3::Functional::ShaderUintPrecisionCase::~ShaderUintPrecisionCase
          (ShaderUintPrecisionCase *this)

{
  ~ShaderUintPrecisionCase(this);
  operator_delete(this,0xf0);
  return;
}

Assistant:

ShaderUintPrecisionCase::~ShaderUintPrecisionCase (void)
{
	ShaderUintPrecisionCase::deinit();
}